

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAndisr<(moira::Instr)62,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  u16 uVar1;
  u32 uVar2;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 result;
  u16 dst;
  u32 src;
  u32 in_stack_ffffffffffffffdc;
  u32 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  u32 op1;
  undefined2 in_stack_fffffffffffffff4;
  
  if (((in_RDI->reg).sr.s & 1U) == 0) {
    execPrivilegeException(in_RDI);
  }
  else {
    uVar2 = readI<(moira::Size)2>(in_RDI);
    uVar1 = getSR((Moira *)0x274f58);
    op1 = CONCAT22(uVar1,in_stack_ffffffffffffffec);
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,8);
    logic<(moira::Instr)62,(moira::Size)2>
              ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),op1,
               in_stack_ffffffffffffffe8);
    setSR(in_RDI,(u16)(in_stack_ffffffffffffffdc >> 0x10));
    readM<(moira::MemSpace)1,(moira::Size)2,0ul>(in_RDI,in_stack_ffffffffffffffdc);
    prefetch<4ul>(in_RDI);
  }
  return;
}

Assistant:

void
Moira::execAndisr(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    u32 src = readI<S>();
    u16 dst = getSR();

    sync(8);

    u32 result = logic<I,S>(src, dst);
    setSR(result);

    (void)readM<MEM_DATA, Word>(reg.pc+2);
    prefetch<POLLIPL>();
}